

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

void __thiscall QList<Header>::removeAt(QList<Header> *this,qsizetype i)

{
  remove(this,(char *)i);
  return;
}

Assistant:

void removeAt(qsizetype i) { remove(i); }